

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::getSkeleton
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *pattern,UErrorCode *param_2)

{
  undefined1 local_df0 [8];
  PtnSkeleton localSkeleton;
  undefined1 local_d50 [8];
  DateTimeMatcher matcher;
  FormatParser fp2;
  UErrorCode *param_2_local;
  UnicodeString *pattern_local;
  DateTimePatternGenerator *this_local;
  
  FormatParser::FormatParser((FormatParser *)&matcher.skeleton.addedDefaultDayPeriod);
  DateTimeMatcher::DateTimeMatcher((DateTimeMatcher *)local_d50);
  PtnSkeleton::PtnSkeleton((PtnSkeleton *)local_df0);
  DateTimeMatcher::set
            ((DateTimeMatcher *)local_d50,pattern,
             (FormatParser *)&matcher.skeleton.addedDefaultDayPeriod,(PtnSkeleton *)local_df0);
  PtnSkeleton::getSkeleton(__return_storage_ptr__,(PtnSkeleton *)local_df0);
  PtnSkeleton::~PtnSkeleton((PtnSkeleton *)local_df0);
  DateTimeMatcher::~DateTimeMatcher((DateTimeMatcher *)local_d50);
  FormatParser::~FormatParser((FormatParser *)&matcher.skeleton.addedDefaultDayPeriod);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::getSkeleton(const UnicodeString& pattern, UErrorCode&
/*status*/) {
    FormatParser fp2;
    DateTimeMatcher matcher;
    PtnSkeleton localSkeleton;
    matcher.set(pattern, &fp2, localSkeleton);
    return localSkeleton.getSkeleton();
}